

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer_tests.cpp
# Opt level: O0

void check_remove(json *example,string *path,json *expected)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  ExprLhs<const_std::error_code_&> this;
  ExprLhs<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  this_00;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  error_code ec;
  Decomposer *in_stack_fffffffffffffe68;
  ITransientExpression *expr;
  AssertionHandler *in_stack_fffffffffffffe70;
  SourceLineInfo *this_01;
  AssertionHandler *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  size_type in_stack_fffffffffffffe90;
  ExprLhs<const_std::error_code_&> *in_stack_fffffffffffffe98;
  AssertionHandler *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  ITransientExpression local_128;
  StringRef local_118;
  error_code *local_a8;
  SourceLineInfo local_90;
  StringRef local_80;
  
  std::error_code::error_code((error_code *)in_stack_fffffffffffffe70);
  jsoncons::jsonpointer::
  remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::__cxx11::string>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (error_code *)in_stack_fffffffffffffea0);
  local_80 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
  this_01 = &local_90;
  Catch::SourceLineInfo::SourceLineInfo
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpointer/src/jsonpointer_tests.cpp"
             ,0x47);
  Catch::StringRef::StringRef((StringRef *)in_stack_fffffffffffffe80,(char *)this_01);
  Catch::operator|(ContinueOnFailure,FalseTest);
  capturedExpression.m_size = in_stack_fffffffffffffe90;
  capturedExpression.m_start = in_stack_fffffffffffffe88;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffe80,(StringRef *)this_01,
             (SourceLineInfo *)in_stack_fffffffffffffe70,capturedExpression,
             (Flags)((ulong)in_stack_fffffffffffffe68 >> 0x20));
  this = Catch::Decomposer::operator<=(in_stack_fffffffffffffe68,(error_code *)0x7156dd);
  local_a8 = this.m_lhs;
  Catch::AssertionHandler::handleExpr<std::error_code_const&>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffe70);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffe70);
  local_118 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
  expr = &local_128;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)expr,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpointer/src/jsonpointer_tests.cpp"
             ,0x48);
  Catch::StringRef::StringRef((StringRef *)this.m_lhs,(char *)this_01);
  capturedExpression_00.m_size = in_stack_fffffffffffffe90;
  capturedExpression_00.m_start = in_stack_fffffffffffffe88;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)this.m_lhs,(StringRef *)this_01,
             (SourceLineInfo *)in_stack_fffffffffffffe70,capturedExpression_00,
             (Flags)((ulong)expr >> 0x20));
  this_00 = Catch::Decomposer::operator<=
                      ((Decomposer *)expr,
                       (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x7157e8)
  ;
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==((ExprLhs<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)in_stack_fffffffffffffea8,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             in_stack_fffffffffffffea0);
  Catch::AssertionHandler::handleExpr((AssertionHandler *)this_00.m_lhs,expr);
  Catch::
  BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::~BinaryExpr((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *)0x715830);
  Catch::AssertionHandler::complete((AssertionHandler *)this_00.m_lhs);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)this_00.m_lhs);
  return;
}

Assistant:

void check_remove(json& example, const std::string& path, const json& expected)
{
    std::error_code ec;
    jsonpointer::remove(example, path, ec);
    CHECK_FALSE(ec);
    CHECK(expected == example);
}